

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O1

void __thiscall sf2cute::RIFF::~RIFF(RIFF *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_RIFF = (_func_int **)&PTR__RIFF_0011e980;
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ::~vector(&this->chunks_);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  paVar2 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~RIFF() = default;